

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(TypeManager *this,Instruction *inst)

{
  IdToTypeMap *this_00;
  pointer pOVar1;
  pointer pOVar2;
  Instruction *this_01;
  uint **ppuVar3;
  uint *__first;
  mapped_type pTVar4;
  pointer __position;
  pointer ppIVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t use;
  uint32_t uVar8;
  StorageClass sc;
  ImageFormat f;
  Function *this_02;
  Struct *this_03;
  CooperativeVectorNV *this_04;
  Vector *this_05;
  Opaque *this_06;
  Operand *pOVar9;
  mapped_type *ppIVar10;
  uint **ppuVar11;
  const_iterator __last;
  TensorLayoutNV *this_07;
  TensorViewNV *this_08;
  CooperativeMatrixKHR *this_09;
  CooperativeMatrixNV *this_10;
  Type *pTVar12;
  Matrix *this_11;
  Pointer *this_12;
  Image *this_13;
  Type *pTVar13;
  NodePayloadArrayAMDX *this_14;
  size_type sVar14;
  DecorationManager *pDVar15;
  mapped_type *ppTVar16;
  mapped_type *pmVar17;
  Array *this_15;
  undefined **ppuVar18;
  undefined *puVar19;
  Op OVar20;
  pointer ppIVar21;
  uint32_t i;
  uint32_t uVar22;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__k;
  TypeManager *this_16;
  MessageConsumer *consumer;
  char *message;
  Type *unaff_R12;
  __ireturn_type _Var23;
  AccessQualifier qualifier;
  Type *type;
  bool has_spec_id;
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  uint32_t return_type_id;
  undefined4 uStack_bc;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  uint32_t local_8c;
  float local_88;
  Dim local_84;
  TypeManager *local_80;
  Type *local_78;
  _Any_data local_70;
  __node_base local_60;
  code *local_58;
  string local_50;
  
  bVar6 = IsTypeInst(inst->opcode_);
  if (!bVar6) {
    return (Type *)0x0;
  }
  type = (Type *)0x0;
  OVar20 = inst->opcode_;
  switch(OVar20) {
  case OpTypeVoid:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    ppuVar18 = &PTR__Type_00a68cc8;
    goto LAB_0046a5b9;
  case OpTypeBool:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kBool;
    ppuVar18 = &PTR__Type_00a68f28;
    goto LAB_0046a5b9;
  case OpTypeInt:
    pTVar12 = (Type *)::operator_new(0x30);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    uVar7 = Instruction::GetSingleWordInOperand(inst,1);
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar12->kind_ = kInteger;
    pTVar12->_vptr_Type = (_func_int **)&PTR__Type_00a6c948;
    *(uint32_t *)&pTVar12->field_0x24 = uVar22;
    *(bool *)&pTVar12[1]._vptr_Type = uVar7 != 0;
    type = pTVar12;
    break;
  case OpTypeFloat:
    pTVar12 = (Type *)::operator_new(0x28);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar12->kind_ = kFloat;
    puVar19 = &Float::vtable;
    goto LAB_0046a5f1;
  case OpTypeVector:
    this_05 = (Vector *)::operator_new(0x38);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    pTVar12 = GetType(this,uVar22);
    uVar22 = Instruction::GetSingleWordInOperand(inst,1);
    Vector::Vector(this_05,pTVar12,uVar22);
    type = (Type *)this_05;
    break;
  case OpTypeMatrix:
    this_11 = (Matrix *)::operator_new(0x38);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    pTVar12 = GetType(this,uVar22);
    uVar22 = Instruction::GetSingleWordInOperand(inst,1);
    Matrix::Matrix(this_11,pTVar12,uVar22);
    type = (Type *)this_11;
    break;
  case OpTypeImage:
    uVar22 = Instruction::NumInOperands(inst);
    f = ImageFormatUnknown;
    if (7 < uVar22) {
      f = Instruction::GetSingleWordInOperand(inst,7);
    }
    this_13 = (Image *)::operator_new(0x48);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    local_78 = GetType(this,uVar22);
    local_84 = Instruction::GetSingleWordInOperand(inst,1);
    local_88 = (float)Instruction::GetSingleWordInOperand(inst,2);
    uVar22 = Instruction::GetSingleWordInOperand(inst,3);
    uVar7 = Instruction::GetSingleWordInOperand(inst,4);
    Instruction::GetSingleWordInOperand(inst,5);
    qualifier = 0x46a3f9;
    uVar8 = Instruction::GetSingleWordInOperand(inst,6);
    Image::Image(this_13,local_78,local_84,(uint32_t)local_88,uVar22 == 1,uVar7 == 1,uVar8,f,
                 qualifier);
    type = (Type *)this_13;
    break;
  case OpTypeSampler:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kSampler;
    ppuVar18 = &PTR__Type_00a69188;
    goto LAB_0046a5b9;
  case OpTypeSampledImage:
    pTVar12 = (Type *)::operator_new(0x30);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    pTVar13 = GetType(this,uVar22);
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar12->kind_ = kSampledImage;
    pTVar12->_vptr_Type = (_func_int **)&PTR__Type_00a6ce08;
    pTVar12[1]._vptr_Type = (_func_int **)pTVar13;
    type = pTVar12;
    break;
  case OpTypeArray:
    uVar22 = Instruction::GetSingleWordInOperand(inst,1);
    _return_type_id = (key_type)CONCAT44(uStack_bc,uVar22);
    ppIVar10 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_constant_inst_,&return_type_id);
    this_01 = *ppIVar10;
    if (this_01 == (Instruction *)0x0) {
      __assert_fail("length_constant_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x33a,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,&decorations);
    id = 0;
    has_spec_id = false;
    OVar20 = this_01->opcode_;
    if (OVar20 == OpSpecConstant) {
      pDVar15 = IRContext::get_decoration_mgr(this->context_);
      local_70._M_unused._M_object = &id;
      local_70._8_8_ = &has_spec_id;
      local_58 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
                 ::_M_invoke;
      local_60._M_nxt =
           (_Hash_node_base *)
           std::
           _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
           ::_M_manager;
      DecorationManager::ForEachDecoration
                (pDVar15,return_type_id,1,
                 (function<void_(const_spvtools::opt::Instruction_&)> *)&local_70);
      if (local_60._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)local_60._M_nxt)(&local_70,&local_70,3);
      }
      OVar20 = this_01->opcode_;
      if ((has_spec_id & 1U) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&extra_words,&id);
      }
    }
    __position = extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    if ((OVar20 == OpSpecConstant) || (OVar20 == OpConstant)) {
      pOVar9 = Instruction::GetOperand(this_01,2);
      ppuVar3 = (uint **)(pOVar9->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar11 = &(pOVar9->words).small_data_;
      if (ppuVar3 != (uint **)0x0) {
        ppuVar11 = ppuVar3;
      }
      __first = *ppuVar11;
      pOVar9 = Instruction::GetOperand(this_01,2);
      __last = utils::SmallVector<unsigned_int,_2UL>::end(&pOVar9->words);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                 (const_iterator)__position,__first,__last);
      *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = (uint)has_spec_id;
      unaff_R12 = (Type *)__position;
    }
    else {
      if (*extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != 2) {
        __assert_fail("extra_words[0] == Array::LengthInfo::kDefiningId",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x35c,
                      "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                     );
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&extra_words,&return_type_id);
    }
    if ((ulong)((long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 5) {
      __assert_fail("extra_words.size() >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x35f,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,return_type_id);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,&extra_words);
    this_15 = (Array *)::operator_new(0x50);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    pTVar12 = GetType(this,uVar22);
    Array::Array(this_15,pTVar12,(LengthInfo *)&decorations);
    type = (Type *)this_15;
    local_8c = Instruction::GetSingleWordInOperand(inst,0);
    sVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&(this->id_to_incomplete_type_)._M_h,&local_8c);
    local_80 = this;
    if (sVar14 != 0) {
      local_8c = Instruction::result_id(inst);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,&local_8c,&type);
      pTVar12 = type;
      local_8c = Instruction::result_id(inst);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,&local_8c);
      *ppTVar16 = pTVar12;
      unaff_R12 = type;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               &decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    this = local_80;
    if (sVar14 != 0) {
      return unaff_R12;
    }
    break;
  case OpTypeRuntimeArray:
    this_14 = (NodePayloadArrayAMDX *)::operator_new(0x30);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    pTVar12 = GetType(this,uVar22);
    RuntimeArray::RuntimeArray((RuntimeArray *)this_14,pTVar12);
LAB_0046a51a:
    type = &this_14->super_Type;
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
    sVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&(this->id_to_incomplete_type_)._M_h,(key_type_conflict *)&decorations);
    if (sVar14 != 0) {
      uVar22 = Instruction::result_id(inst);
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&decorations,&type);
      pTVar12 = type;
      uVar22 = Instruction::result_id(inst);
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
      __k = &decorations;
LAB_0046a583:
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)__k);
      *ppTVar16 = pTVar12;
      return type;
    }
    break;
  case OpTypeStruct:
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = false;
    for (uVar22 = 0; uVar7 = Instruction::NumInOperands(inst), uVar22 < uVar7; uVar22 = uVar22 + 1)
    {
      uVar7 = Instruction::GetSingleWordInOperand(inst,uVar22);
      _return_type_id = (key_type)CONCAT44(uStack_bc,uVar7);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)GetType(this,uVar7);
      std::
      vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
      ::emplace_back<spvtools::opt::analysis::Type_const*>
                ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                  *)&decorations,(Type **)&extra_words);
      sVar14 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->id_to_incomplete_type_)._M_h,&return_type_id);
      bVar6 = (bool)(bVar6 | sVar14 != 0);
    }
    this_03 = (Struct *)::operator_new(0x70);
    Struct::Struct(this_03,(vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            *)&decorations);
    type = (Type *)this_03;
    if (bVar6) {
      uVar22 = Instruction::result_id(inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar22);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar12 = type;
      uVar22 = Instruction::result_id(inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar22);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)&extra_words);
      *ppTVar16 = pTVar12;
    }
    pTVar12 = type;
    std::
    _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~_Vector_base((_Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     *)&decorations);
    goto LAB_00469cd0;
  case OpTypeOpaque:
    this_06 = (Opaque *)::operator_new(0x48);
    pOVar9 = Instruction::GetInOperand(inst,0);
    Operand::AsString_abi_cxx11_(&local_50,pOVar9);
    Opaque::Opaque(this_06,&local_50);
    type = (Type *)this_06;
    std::__cxx11::string::_M_dispose();
    break;
  case OpTypePointer:
    uVar22 = Instruction::GetSingleWordInOperand(inst,1);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
    this_12 = (Pointer *)::operator_new(0x38);
    pTVar12 = GetType(this,uVar22);
    sc = Instruction::GetSingleWordInOperand(inst,0);
    Pointer::Pointer(this_12,pTVar12,sc);
    type = (Type *)this_12;
    sVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&(this->id_to_incomplete_type_)._M_h,(key_type_conflict *)&decorations);
    if (sVar14 == 0) {
      uVar22 = Instruction::result_id(inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar22);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->id_to_incomplete_type_)._M_h);
      break;
    }
    uVar22 = Instruction::result_id(inst);
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(extra_words.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,uVar22);
    std::
    vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
    ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
              ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                *)&this->incomplete_types_,(uint *)&extra_words,&type);
    pTVar12 = type;
    uVar22 = Instruction::result_id(inst);
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(extra_words.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,uVar22);
    __k = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
          &extra_words;
    goto LAB_0046a583;
  case OpTypeFunction:
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    _return_type_id = (key_type)CONCAT44(uStack_bc,uVar22);
    this_00 = &this->id_to_incomplete_type_;
    sVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&this_00->_M_h,&return_type_id);
    bVar6 = sVar14 != 0;
    pTVar12 = GetType(this,return_type_id);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar22 = 1; uVar7 = Instruction::NumInOperands(inst), uVar22 < uVar7; uVar22 = uVar22 + 1)
    {
      id = Instruction::GetSingleWordInOperand(inst,uVar22);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)GetType(this,id);
      std::
      vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
      ::emplace_back<spvtools::opt::analysis::Type_const*>
                ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                  *)&decorations,(Type **)&extra_words);
      sVar14 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&this_00->_M_h,&id);
      bVar6 = (bool)(bVar6 | sVar14 != 0);
    }
    this_02 = (Function *)::operator_new(0x48);
    analysis::Function::Function
              (this_02,pTVar12,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&decorations);
    type = (Type *)this_02;
    if (bVar6) {
      uVar22 = Instruction::result_id(inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar22);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar12 = type;
      uVar22 = Instruction::result_id(inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar22);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&extra_words);
      *ppTVar16 = pTVar12;
    }
    pTVar12 = type;
    std::
    _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~_Vector_base((_Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     *)&decorations);
LAB_00469cd0:
    if (bVar6) {
      return pTVar12;
    }
    break;
  case OpTypeEvent:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kEvent;
    ppuVar18 = &PTR__Type_00a693e8;
    goto LAB_0046a5b9;
  case OpTypeDeviceEvent:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kDeviceEvent;
    ppuVar18 = &PTR__Type_00a69648;
    goto LAB_0046a5b9;
  case OpTypeReserveId:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kReserveId;
    ppuVar18 = &PTR__Type_00a698a8;
    goto LAB_0046a5b9;
  case OpTypeQueue:
    type = (Type *)::operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kQueue;
    ppuVar18 = &PTR__Type_00a69b08;
    goto LAB_0046a5b9;
  case OpTypePipe:
    pTVar12 = (Type *)::operator_new(0x28);
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar12->kind_ = kPipe;
    puVar19 = &Pipe::vtable;
LAB_0046a5f1:
    pTVar12->_vptr_Type = (_func_int **)(puVar19 + 0x10);
    *(uint32_t *)&pTVar12->field_0x24 = uVar22;
    type = pTVar12;
    break;
  case OpTypeForwardPointer:
    uVar22 = Instruction::GetSingleWordInOperand(inst,0);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
    pTVar12 = (Type *)::operator_new(0x38);
    uVar7 = Instruction::GetSingleWordInOperand(inst,1);
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar12->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar12->kind_ = kForwardPointer;
    pTVar12->_vptr_Type = (_func_int **)&PTR__Type_00a6d528;
    *(uint32_t *)&pTVar12->field_0x24 = uVar22;
    *(uint32_t *)&pTVar12[1]._vptr_Type = uVar7;
    pTVar12[1].decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    type = pTVar12;
    std::
    vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
    ::emplace_back<unsigned_int&,spvtools::opt::analysis::Type*&>
              ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                *)&this->incomplete_types_,(uint *)&decorations,&type);
    pTVar12 = type;
    ppTVar16 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_incomplete_type_,(key_type *)&decorations);
    *ppTVar16 = pTVar12;
    return type;
  default:
    if (OVar20 == OpTypePipeStorage) {
      type = (Type *)::operator_new(0x28);
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      type->kind_ = kPipeStorage;
      ppuVar18 = &PTR__Type_00a69d68;
    }
    else if (OVar20 == OpTypeNamedBarrier) {
      type = (Type *)::operator_new(0x28);
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (type->decorations_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      type->kind_ = kNamedBarrier;
      ppuVar18 = &PTR__Type_00a69fc8;
    }
    else {
      if (OVar20 == OpTypeCooperativeMatrixKHR) {
        this_09 = (CooperativeMatrixKHR *)::operator_new(0x40);
        uVar22 = Instruction::GetSingleWordInOperand(inst,0);
        pTVar12 = GetType(this,uVar22);
        uVar22 = Instruction::GetSingleWordInOperand(inst,1);
        uVar7 = Instruction::GetSingleWordInOperand(inst,2);
        uVar8 = Instruction::GetSingleWordInOperand(inst,3);
        use = Instruction::GetSingleWordInOperand(inst,4);
        CooperativeMatrixKHR::CooperativeMatrixKHR(this_09,pTVar12,uVar22,uVar7,uVar8,use);
        type = (Type *)this_09;
        break;
      }
      if (OVar20 == OpTypeRayQueryKHR) {
        type = (Type *)::operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kRayQueryKHR;
        ppuVar18 = &PTR__Type_00a6a488;
      }
      else {
        if (OVar20 == OpTypeNodePayloadArrayAMDX) {
          this_14 = (NodePayloadArrayAMDX *)::operator_new(0x30);
          uVar22 = Instruction::GetSingleWordInOperand(inst,0);
          pTVar12 = GetType(this,uVar22);
          NodePayloadArrayAMDX::NodePayloadArrayAMDX(this_14,pTVar12);
          goto LAB_0046a51a;
        }
        if (OVar20 == OpTypeHitObjectNV) {
          type = (Type *)::operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kHitObjectNV;
          ppuVar18 = &PTR__Type_00a6a6e8;
        }
        else {
          if (OVar20 == OpTypeCooperativeVectorNV) {
            this_04 = (CooperativeVectorNV *)::operator_new(0x38);
            uVar22 = Instruction::GetSingleWordInOperand(inst,0);
            pTVar12 = GetType(this,uVar22);
            uVar22 = Instruction::GetSingleWordInOperand(inst,1);
            CooperativeVectorNV::CooperativeVectorNV(this_04,pTVar12,uVar22);
            type = (Type *)this_04;
            break;
          }
          if (OVar20 != OpTypeAccelerationStructureKHR) {
            if (OVar20 == OpTypeCooperativeMatrixNV) {
              this_10 = (CooperativeMatrixNV *)::operator_new(0x40);
              uVar22 = Instruction::GetSingleWordInOperand(inst,0);
              pTVar12 = GetType(this,uVar22);
              uVar22 = Instruction::GetSingleWordInOperand(inst,1);
              uVar7 = Instruction::GetSingleWordInOperand(inst,2);
              uVar8 = Instruction::GetSingleWordInOperand(inst,3);
              CooperativeMatrixNV::CooperativeMatrixNV(this_10,pTVar12,uVar22,uVar7,uVar8);
              type = (Type *)this_10;
            }
            else if (OVar20 == OpTypeTensorLayoutNV) {
              this_07 = (TensorLayoutNV *)::operator_new(0x30);
              uVar22 = Instruction::GetSingleWordInOperand(inst,0);
              uVar7 = Instruction::GetSingleWordInOperand(inst,1);
              TensorLayoutNV::TensorLayoutNV(this_07,uVar22,uVar7);
              type = (Type *)this_07;
            }
            else {
              if (OVar20 != OpTypeTensorViewNV) {
                __assert_fail("false && \"Type not handled by the type manager.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                              ,0x3fc,
                              "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                             );
              }
              pOVar1 = (inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pOVar2 = (inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              for (uVar22 = 2; uVar22 < (uint)(((long)pOVar1 - (long)pOVar2) / 0x30);
                  uVar22 = uVar22 + 1) {
                uVar7 = Instruction::GetSingleWordOperand(inst,uVar22);
                extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(extra_words.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar7);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations,
                           (uint *)&extra_words);
              }
              this_08 = (TensorViewNV *)::operator_new(0x48);
              uVar22 = Instruction::GetSingleWordInOperand(inst,0);
              uVar7 = Instruction::GetSingleWordInOperand(inst,1);
              TensorViewNV::TensorViewNV
                        (this_08,uVar22,uVar7,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations);
              type = (Type *)this_08;
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations);
            }
            break;
          }
          type = (Type *)::operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kAccelerationStructureNV;
          ppuVar18 = &PTR__Type_00a6a228;
        }
      }
    }
LAB_0046a5b9:
    type->_vptr_Type = (_func_int **)ppuVar18;
  }
  uVar22 = Instruction::result_id(inst);
  id = uVar22;
  if (uVar22 == 0) {
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x401;
    message = "assertion failed: instruction without result id found";
  }
  else {
    if (type != (Type *)0x0) {
      pDVar15 = IRContext::get_decoration_mgr(this->context_);
      this_16 = (TypeManager *)&decorations;
      DecorationManager::GetDecorationsFor
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this_16,pDVar15,uVar22,true);
      ppIVar5 = decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar21 = decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar5;
          ppIVar21 = ppIVar21 + 1) {
        AttachDecoration(this_16,*ppIVar21,type);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)type;
      _Var23 = std::__detail::
               _Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
               ::insert((_Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                         *)&this->type_pool_,(value_type *)&extra_words);
      pTVar4 = *(mapped_type *)
                ((long)_Var23.first.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                + 8);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_type_,&id);
      uVar22 = id;
      *ppTVar16 = pTVar4;
      _return_type_id =
           *(key_type *)
            ((long)_Var23.first.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
            + 8);
      pmVar17 = std::__detail::
                _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->type_to_id_,(key_type *)&return_type_id);
      pTVar12 = type;
      *pmVar17 = uVar22;
      if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)extra_words.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&decorations.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return pTVar12;
    }
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x403;
    message = "assertion failed: type should not be nullptr at this point";
  }
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Log(consumer,SPV_MSG_INTERNAL_ERROR,
      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
      ,(spv_position_t *)&decorations,message);
  exit(1);
}

Assistant:

Type* TypeManager::RecordIfTypeDefinition(const Instruction& inst) {
  if (!IsTypeInst(inst.opcode())) return nullptr;

  Type* type = nullptr;
  switch (inst.opcode()) {
    case spv::Op::OpTypeVoid:
      type = new Void();
      break;
    case spv::Op::OpTypeBool:
      type = new Bool();
      break;
    case spv::Op::OpTypeInt:
      type = new Integer(inst.GetSingleWordInOperand(0),
                         inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeFloat:
      type = new Float(inst.GetSingleWordInOperand(0));
      break;
    case spv::Op::OpTypeVector:
      type = new Vector(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeMatrix:
      type = new Matrix(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeImage: {
      const spv::AccessQualifier access =
          inst.NumInOperands() < 8 ? spv::AccessQualifier::ReadOnly
                                   : static_cast<spv::AccessQualifier>(
                                         inst.GetSingleWordInOperand(7));
      type = new Image(
          GetType(inst.GetSingleWordInOperand(0)),
          static_cast<spv::Dim>(inst.GetSingleWordInOperand(1)),
          inst.GetSingleWordInOperand(2), inst.GetSingleWordInOperand(3) == 1,
          inst.GetSingleWordInOperand(4) == 1, inst.GetSingleWordInOperand(5),
          static_cast<spv::ImageFormat>(inst.GetSingleWordInOperand(6)),
          access);
    } break;
    case spv::Op::OpTypeSampler:
      type = new Sampler();
      break;
    case spv::Op::OpTypeSampledImage:
      type = new SampledImage(GetType(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeArray: {
      const uint32_t length_id = inst.GetSingleWordInOperand(1);
      const Instruction* length_constant_inst = id_to_constant_inst_[length_id];
      assert(length_constant_inst);

      // How will we distinguish one length value from another?
      // Determine extra words required to distinguish this array length
      // from another.
      std::vector<uint32_t> extra_words{Array::LengthInfo::kDefiningId};
      // If it is a specialised constant, retrieve its SpecId.
      // Only OpSpecConstant has a SpecId.
      uint32_t spec_id = 0u;
      bool has_spec_id = false;
      if (length_constant_inst->opcode() == spv::Op::OpSpecConstant) {
        context()->get_decoration_mgr()->ForEachDecoration(
            length_id, uint32_t(spv::Decoration::SpecId),
            [&spec_id, &has_spec_id](const Instruction& decoration) {
              assert(decoration.opcode() == spv::Op::OpDecorate);
              spec_id = decoration.GetSingleWordOperand(2u);
              has_spec_id = true;
            });
      }
      const auto opcode = length_constant_inst->opcode();
      if (has_spec_id) {
        extra_words.push_back(spec_id);
      }
      if ((opcode == spv::Op::OpConstant) ||
          (opcode == spv::Op::OpSpecConstant)) {
        // Always include the literal constant words.  In the spec constant
        // case, the constant might not be overridden, so it's still
        // significant.
        extra_words.insert(extra_words.end(),
                           length_constant_inst->GetOperand(2).words.begin(),
                           length_constant_inst->GetOperand(2).words.end());
        extra_words[0] = has_spec_id ? Array::LengthInfo::kConstantWithSpecId
                                     : Array::LengthInfo::kConstant;
      } else {
        assert(extra_words[0] == Array::LengthInfo::kDefiningId);
        extra_words.push_back(length_id);
      }
      assert(extra_words.size() >= 2);
      Array::LengthInfo length_info{length_id, extra_words};

      type = new Array(GetType(inst.GetSingleWordInOperand(0)), length_info);

      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeRuntimeArray:
      type = new RuntimeArray(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeNodePayloadArrayAMDX:
      type = new NodePayloadArrayAMDX(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeStruct: {
      std::vector<const Type*> element_types;
      bool incomplete_type = false;
      for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
        uint32_t type_id = inst.GetSingleWordInOperand(i);
        element_types.push_back(GetType(type_id));
        if (id_to_incomplete_type_.count(type_id)) {
          incomplete_type = true;
        }
      }
      type = new Struct(element_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeOpaque: {
      type = new Opaque(inst.GetInOperand(0).AsString());
    } break;
    case spv::Op::OpTypePointer: {
      uint32_t pointee_type_id = inst.GetSingleWordInOperand(1);
      type = new Pointer(
          GetType(pointee_type_id),
          static_cast<spv::StorageClass>(inst.GetSingleWordInOperand(0)));

      if (id_to_incomplete_type_.count(pointee_type_id)) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      id_to_incomplete_type_.erase(inst.result_id());

    } break;
    case spv::Op::OpTypeFunction: {
      bool incomplete_type = false;
      uint32_t return_type_id = inst.GetSingleWordInOperand(0);
      if (id_to_incomplete_type_.count(return_type_id)) {
        incomplete_type = true;
      }
      Type* return_type = GetType(return_type_id);
      std::vector<const Type*> param_types;
      for (uint32_t i = 1; i < inst.NumInOperands(); ++i) {
        uint32_t param_type_id = inst.GetSingleWordInOperand(i);
        param_types.push_back(GetType(param_type_id));
        if (id_to_incomplete_type_.count(param_type_id)) {
          incomplete_type = true;
        }
      }

      type = new Function(return_type, param_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeEvent:
      type = new Event();
      break;
    case spv::Op::OpTypeDeviceEvent:
      type = new DeviceEvent();
      break;
    case spv::Op::OpTypeReserveId:
      type = new ReserveId();
      break;
    case spv::Op::OpTypeQueue:
      type = new Queue();
      break;
    case spv::Op::OpTypePipe:
      type = new Pipe(
          static_cast<spv::AccessQualifier>(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeForwardPointer: {
      // Handling of forward pointers is different from the other types.
      uint32_t target_id = inst.GetSingleWordInOperand(0);
      type = new ForwardPointer(target_id, static_cast<spv::StorageClass>(
                                               inst.GetSingleWordInOperand(1)));
      incomplete_types_.emplace_back(target_id, type);
      id_to_incomplete_type_[target_id] = type;
      return type;
    }
    case spv::Op::OpTypePipeStorage:
      type = new PipeStorage();
      break;
    case spv::Op::OpTypeNamedBarrier:
      type = new NamedBarrier();
      break;
    case spv::Op::OpTypeAccelerationStructureNV:
      type = new AccelerationStructureNV();
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
      type = new CooperativeMatrixNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1),
                                     inst.GetSingleWordInOperand(2),
                                     inst.GetSingleWordInOperand(3));
      break;
    case spv::Op::OpTypeCooperativeMatrixKHR:
      type = new CooperativeMatrixKHR(
          GetType(inst.GetSingleWordInOperand(0)),
          inst.GetSingleWordInOperand(1), inst.GetSingleWordInOperand(2),
          inst.GetSingleWordInOperand(3), inst.GetSingleWordInOperand(4));
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      type = new CooperativeVectorNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeRayQueryKHR:
      type = new RayQueryKHR();
      break;
    case spv::Op::OpTypeHitObjectNV:
      type = new HitObjectNV();
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      type = new TensorLayoutNV(inst.GetSingleWordInOperand(0),
                                inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeTensorViewNV: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> perm;
      for (uint32_t i = 2; i < count; ++i) {
        perm.push_back(inst.GetSingleWordOperand(i));
      }
      type = new TensorViewNV(inst.GetSingleWordInOperand(0),
                              inst.GetSingleWordInOperand(1), perm);
      break;
    }
    default:
      assert(false && "Type not handled by the type manager.");
      break;
  }

  uint32_t id = inst.result_id();
  SPIRV_ASSERT(consumer_, id != 0, "instruction without result id found");
  SPIRV_ASSERT(consumer_, type != nullptr,
               "type should not be nullptr at this point");
  std::vector<Instruction*> decorations =
      context()->get_decoration_mgr()->GetDecorationsFor(id, true);
  for (auto dec : decorations) {
    AttachDecoration(*dec, type);
  }
  std::unique_ptr<Type> unique(type);
  auto pair = type_pool_.insert(std::move(unique));
  id_to_type_[id] = pair.first->get();
  type_to_id_[pair.first->get()] = id;
  return type;
}